

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

bool QtPrivate::equalStrings(QLatin1StringView lhs,QStringView rhs)

{
  storage_type_conflict *psVar1;
  byte bVar2;
  storage_type_conflict *psVar3;
  storage_type_conflict *psVar4;
  byte *pbVar5;
  
  pbVar5 = (byte *)lhs.m_data;
  psVar1 = rhs.m_data + rhs.m_size;
  psVar3 = rhs.m_data;
  do {
    psVar4 = psVar3;
    if (psVar1 <= psVar4) break;
    bVar2 = *pbVar5;
    pbVar5 = pbVar5 + 1;
    psVar3 = psVar4 + 1;
  } while (*psVar4 == (ushort)bVar2);
  return psVar1 <= psVar4;
}

Assistant:

static int ucstrncmp(const char16_t *a, const char *b, size_t l)
{
    const uchar *c = reinterpret_cast<const uchar *>(b);
    const char16_t *uc = a;
    const char16_t *e = uc + l;

#if defined(__SSE2__) && !defined(__OPTIMIZE_SIZE__)
    return ucstrncmp_sse2<Mode>(uc, c, l);
#endif

    while (uc < e) {
        int diff = *uc - *c;
        if (diff)
            return diff;
        uc++, c++;
    }

    return 0;
}